

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O0

void re2c::output_if(OutputFile *o,uint32_t ind,bool *readCh,string *compare,uint32_t value)

{
  OutputFile *pOVar1;
  bool *readCh_00;
  string local_50;
  uint32_t local_2c;
  string *psStack_28;
  uint32_t value_local;
  string *compare_local;
  bool *readCh_local;
  OutputFile *pOStack_10;
  uint32_t ind_local;
  OutputFile *o_local;
  
  local_2c = value;
  psStack_28 = compare;
  compare_local = (string *)readCh;
  readCh_local._4_4_ = ind;
  pOStack_10 = o;
  pOVar1 = OutputFile::wind(o,ind);
  pOVar1 = OutputFile::ws(pOVar1,"if (");
  output_yych_abi_cxx11_(&local_50,(re2c *)compare_local,readCh_00);
  pOVar1 = OutputFile::wstring(pOVar1,&local_50);
  pOVar1 = OutputFile::ws(pOVar1," ");
  pOVar1 = OutputFile::wstring(pOVar1,psStack_28);
  pOVar1 = OutputFile::ws(pOVar1," ");
  pOVar1 = OutputFile::wc_hex(pOVar1,local_2c);
  OutputFile::ws(pOVar1,") ");
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void output_if (OutputFile & o, uint32_t ind, bool & readCh, const std::string & compare, uint32_t value)
{
	o.wind(ind).ws("if (").wstring(output_yych (readCh)).ws(" ").wstring(compare).ws(" ").wc_hex (value).ws(") ");
}